

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int cvHandleNFlag(CVodeMem cv_mem,int *nflagPtr,realtype saved_t,int *ncfPtr)

{
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  int nflag;
  realtype in_stack_ffffffffffffffc8;
  double dVar1;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  int local_4;
  
  iVar2 = *in_RSI;
  if (iVar2 == 0) {
    local_4 = 2;
  }
  else {
    *(long *)(in_RDI + 0x368) = *(long *)(in_RDI + 0x368) + 1;
    cvRestore((CVodeMem)CONCAT44(iVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
    if (iVar2 < 0) {
      if (iVar2 == -6) {
        local_4 = -6;
      }
      else if (iVar2 == -7) {
        local_4 = -7;
      }
      else if (iVar2 == -8) {
        local_4 = -8;
      }
      else {
        local_4 = -0x10;
      }
    }
    else {
      *in_RDX = *in_RDX + 1;
      *(undefined8 *)(in_RDI + 0x2f8) = 0x3ff0000000000000;
      if ((ABS(*(double *)(in_RDI + 0x140)) <= *(double *)(in_RDI + 0x2e8) * 1.000001) ||
         (*in_RDX == *(int *)(in_RDI + 0x2e0))) {
        if (iVar2 == 0x386) {
          return -4;
        }
        if (iVar2 == 0xb) {
          return -0xf;
        }
        if (iVar2 == 10) {
          return -10;
        }
      }
      if (iVar2 != 0xb) {
        if (*(double *)(in_RDI + 0x340) <=
            *(double *)(in_RDI + 0x2e8) / ABS(*(double *)(in_RDI + 0x140))) {
          dVar1 = *(double *)(in_RDI + 0x2e8) / ABS(*(double *)(in_RDI + 0x140));
        }
        else {
          dVar1 = *(double *)(in_RDI + 0x340);
        }
        *(double *)(in_RDI + 0x158) = dVar1;
      }
      *in_RSI = 7;
      cvRescale((CVodeMem)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

static int cvHandleNFlag(CVodeMem cv_mem, int *nflagPtr, realtype saved_t,
                         int *ncfPtr)
{
  int nflag;

  nflag = *nflagPtr;

  if (nflag == CV_SUCCESS) return(DO_ERROR_TEST);

  /* The nonlinear soln. failed; increment ncfn and restore zn */
  cv_mem->cv_ncfn++;
  cvRestore(cv_mem, saved_t);

  /* Return if failed unrecoverably */
  if (nflag < 0) {
    if (nflag == CV_LSETUP_FAIL)       return(CV_LSETUP_FAIL);
    else if (nflag == CV_LSOLVE_FAIL)  return(CV_LSOLVE_FAIL);
    else if (nflag == CV_RHSFUNC_FAIL) return(CV_RHSFUNC_FAIL);
    else                               return(CV_NLS_FAIL);
  }

  /* At this point, a recoverable error occurred. */

  (*ncfPtr)++;
  cv_mem->cv_etamax = ONE;

  /* If we had maxncf failures or |h| = hmin, return failure. */

  if ((SUNRabs(cv_mem->cv_h) <= cv_mem->cv_hmin*ONEPSM) ||
      (*ncfPtr == cv_mem->cv_maxncf)) {
    if (nflag == SUN_NLS_CONV_RECVR) return(CV_CONV_FAILURE);
    if (nflag == CONSTR_RECVR)       return(CV_CONSTR_FAIL);
    if (nflag == RHSFUNC_RECVR)      return(CV_REPTD_RHSFUNC_ERR);
  }

  /* Reduce step size; return to reattempt the step
     Note that if nflag = CONSTR_RECVR, then eta was already set in cvCheckConstraints */
  if (nflag != CONSTR_RECVR)
    cv_mem->cv_eta = SUNMAX(cv_mem->cv_eta_cf,
                            cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h));
  *nflagPtr = PREV_CONV_FAIL;
  cvRescale(cv_mem);

  return(PREDICT_AGAIN);
}